

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen.cpp
# Opt level: O2

PrimInfo *
embree::sse2::createPrimRefArrayGrids
          (PrimInfo *__return_storage_ptr__,GridMesh *mesh,mvector<PrimRef> *prims,
          mvector<SubGridBuildData> *sgrids)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  SubGridBuildData *ptr;
  PrimRef *ptr_00;
  MemoryMonitorInterface *pMVar3;
  undefined8 uVar4;
  char cVar5;
  int iVar6;
  size_t i;
  task *ptVar7;
  size_t sVar8;
  SubGridBuildData *pSVar9;
  PrimRef *pPVar10;
  long lVar11;
  runtime_error *prVar12;
  size_t sVar13;
  ulong uVar14;
  size_t *psVar15;
  unsigned_long end;
  _func_int **pp_Var16;
  size_t sVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  _func_int **pp_Var21;
  PrimInfo *pPVar22;
  unsigned_long end_1;
  bool bVar23;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar24;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar25;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar26;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar27;
  auto_partitioner local_2961;
  size_t taskCount;
  PrimInfo *local_2958;
  ulong local_2950 [2];
  ulong **local_2940;
  task_traits local_2938;
  uint geomID_;
  GridMesh *mesh_local;
  GridMesh **local_2920;
  mvector<PrimRef> *local_2918;
  mvector<SubGridBuildData> *local_2910;
  uint *local_2908;
  ulong *local_2900;
  ulong *local_28f8;
  size_t *local_28f0;
  ParallelPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> *local_28e8;
  GridMesh ***local_28e0;
  undefined8 local_28d8;
  undefined4 local_28d0;
  wait_context local_28c8;
  task_group_context context;
  ParallelPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> pstate;
  
  local_2918 = (mvector<PrimRef> *)&geomID_;
  geomID_ = 0xffffffff;
  local_2920 = &mesh_local;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar14 = (ulong)(mesh->super_Geometry).numPrimitives;
  local_2950[1] = 0;
  local_2958 = __return_storage_ptr__;
  local_2950[0] = uVar14;
  mesh_local = mesh;
  iVar6 = tbb::detail::d1::max_concurrency();
  pp_Var21 = (_func_int **)(uVar14 + 0x3ff >> 10);
  if ((_func_int **)(long)iVar6 < pp_Var21) {
    pp_Var21 = (_func_int **)(long)iVar6;
  }
  pp_Var16 = (_func_int **)0x40;
  if (pp_Var21 < (_func_int **)0x40) {
    pp_Var16 = pp_Var21;
  }
  local_28f0 = &taskCount;
  local_2900 = local_2950 + 1;
  local_28f8 = local_2950;
  local_28e8 = &pstate;
  taskCount = (size_t)pp_Var16;
  local_28e0 = &local_2920;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  local_2940 = &local_2900;
  if (pp_Var21 != (_func_int **)0x0) {
    local_2938.m_version_and_traits = 0;
    ptVar7 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_2938,0xc0);
    ptVar7->m_reserved[3] = 0;
    ptVar7->m_reserved[4] = 0;
    ptVar7->m_reserved[5] = 0;
    ptVar7->m_reserved[1] = 0;
    ptVar7->m_reserved[2] = 0;
    (ptVar7->super_task_traits).m_version_and_traits = 0;
    ptVar7->m_reserved[0] = 0;
    ptVar7->_vptr_task = (_func_int **)&PTR__task_021d99d0;
    ptVar7[1]._vptr_task = pp_Var16;
    ptVar7[1].super_task_traits.m_version_and_traits = 0;
    ptVar7[1].m_reserved[0] = 1;
    ptVar7[1].m_reserved[1] = (uint64_t)&local_2940;
    ptVar7[1].m_reserved[2] = 0;
    ptVar7[1].m_reserved[3] = 1;
    tbb::detail::d1::auto_partition_type::auto_partition_type
              ((auto_partition_type *)(ptVar7[1].m_reserved + 5),&local_2961);
    ptVar7[2].super_task_traits.m_version_and_traits = local_2938.m_version_and_traits;
    local_28d8 = 0;
    local_28d0 = 1;
    local_28c8.m_version_and_traits = 1;
    local_28c8.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1
    ;
    ptVar7[1].m_reserved[4] = (uint64_t)&local_28d8;
    tbb::detail::r1::execute_and_wait(ptVar7,&context,&local_28c8,&context);
  }
  cVar5 = tbb::detail::r1::is_group_execution_cancelled(&context);
  pPVar22 = local_2958;
  if (cVar5 != '\0') {
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar12,"task cancelled");
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::d1::task_group_context::~task_group_context(&context);
  psVar15 = &pstate.sums[0].end;
  sVar8 = 0;
  sVar17 = 0;
  sVar13 = taskCount;
  aVar24 = _DAT_01f45a30;
  aVar25 = _DAT_01f45a40;
  aVar26 = _DAT_01f45a30;
  aVar27 = _DAT_01f45a40;
  while (bVar23 = sVar13 != 0, sVar13 = sVar13 - 1, bVar23) {
    (((PrimInfoT<embree::BBox<embree::Vec3fa>_> *)(psVar15 + -9))->
    super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 = aVar26;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar15 + -7) = aVar27;
    (((BBox3fa *)(psVar15 + -5))->lower).field_0 = aVar24;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar15 + -3) = aVar25;
    psVar15[-1] = sVar8;
    *psVar15 = sVar17;
    aVar26.m128 = (__m128)minps(aVar26.m128,*(undefined1 (*) [16])(psVar15 + -0x289));
    aVar27.m128 = (__m128)maxps(aVar27.m128,*(undefined1 (*) [16])(psVar15 + -0x287));
    aVar24.m128 = (__m128)minps(aVar24.m128,*(undefined1 (*) [16])(psVar15 + -0x285));
    aVar25.m128 = (__m128)maxps(aVar25.m128,*(undefined1 (*) [16])(psVar15 + -0x283));
    sVar8 = sVar8 + psVar15[-0x281];
    sVar17 = sVar17 + psVar15[-0x280];
    psVar15 = psVar15 + 10;
  }
  (pPVar22->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 = aVar26;
  (pPVar22->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 = aVar27;
  (pPVar22->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 = aVar24;
  (pPVar22->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 = aVar25;
  pPVar22->begin = sVar8;
  pPVar22->end = sVar17;
  uVar18 = sVar17 - sVar8;
  uVar14 = sgrids->size_alloced;
  uVar20 = uVar14;
  if ((uVar14 < uVar18) && (uVar19 = uVar14, uVar20 = uVar18, uVar14 != 0)) {
    for (; uVar20 = uVar19, uVar19 < uVar18; uVar19 = uVar19 * 2 + (ulong)(uVar19 * 2 == 0)) {
    }
  }
  if (uVar18 < sgrids->size_active) {
    sgrids->size_active = uVar18;
  }
  if (uVar14 == uVar20) {
    sgrids->size_active = uVar18;
  }
  else {
    ptr = sgrids->items;
    if (uVar20 == 0) {
      uVar14 = 0;
LAB_003dac37:
      pSVar9 = (SubGridBuildData *)alignedMalloc(uVar14,4);
    }
    else {
      pMVar3 = (sgrids->alloc).device;
      uVar14 = uVar20 * 8;
      (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,uVar14,0);
      if (uVar14 < 0x1c00000) goto LAB_003dac37;
      pSVar9 = (SubGridBuildData *)os_malloc(uVar14,&(sgrids->alloc).hugepages);
    }
    sgrids->items = pSVar9;
    for (uVar14 = 0; uVar14 < sgrids->size_active; uVar14 = uVar14 + 1) {
      sgrids->items[uVar14] = ptr[uVar14];
    }
    sVar13 = sgrids->size_alloced;
    if (ptr != (SubGridBuildData *)0x0) {
      if (sVar13 * 8 < 0x1c00000) {
        alignedFree(ptr);
      }
      else {
        os_free(ptr,sVar13 * 8,(sgrids->alloc).hugepages);
      }
    }
    if (sVar13 != 0) {
      pMVar3 = (sgrids->alloc).device;
      (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,sVar13 * -8,1);
    }
    sgrids->size_active = uVar18;
    sgrids->size_alloced = uVar20;
    pPVar22 = local_2958;
  }
  uVar14 = prims->size_alloced;
  uVar20 = uVar14;
  if ((uVar14 < uVar18) && (uVar19 = uVar14, uVar20 = uVar18, uVar14 != 0)) {
    for (; uVar20 = uVar19, uVar19 < uVar18; uVar19 = uVar19 * 2 + (ulong)(uVar19 * 2 == 0)) {
    }
  }
  if (uVar18 < prims->size_active) {
    prims->size_active = uVar18;
  }
  if (uVar14 == uVar20) {
    prims->size_active = uVar18;
    goto LAB_003dadc1;
  }
  ptr_00 = prims->items;
  if (uVar20 == 0) {
    sVar13 = 0;
LAB_003dad2f:
    pPVar10 = (PrimRef *)alignedMalloc(sVar13,0x20);
  }
  else {
    pMVar3 = (prims->alloc).device;
    sVar13 = uVar20 << 5;
    (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,sVar13,0);
    if (sVar13 < 0x1c00000) goto LAB_003dad2f;
    pPVar10 = (PrimRef *)os_malloc(sVar13,&(prims->alloc).hugepages);
  }
  prims->items = pPVar10;
  lVar11 = 0x10;
  for (uVar14 = 0; uVar14 < prims->size_active; uVar14 = uVar14 + 1) {
    pPVar10 = prims->items;
    puVar1 = (undefined8 *)((long)ptr_00 + lVar11 + -0x10);
    uVar4 = puVar1[1];
    puVar2 = (undefined8 *)((long)pPVar10 + lVar11 + -0x10);
    *puVar2 = *puVar1;
    puVar2[1] = uVar4;
    puVar1 = (undefined8 *)((long)&(ptr_00->lower).field_0 + lVar11);
    uVar4 = puVar1[1];
    puVar2 = (undefined8 *)((long)&(pPVar10->lower).field_0 + lVar11);
    *puVar2 = *puVar1;
    puVar2[1] = uVar4;
    lVar11 = lVar11 + 0x20;
  }
  sVar13 = prims->size_alloced;
  if (ptr_00 != (PrimRef *)0x0) {
    if (sVar13 << 5 < 0x1c00000) {
      alignedFree(ptr_00);
    }
    else {
      os_free(ptr_00,sVar13 << 5,(prims->alloc).hugepages);
    }
  }
  if (sVar13 != 0) {
    pMVar3 = (prims->alloc).device;
    (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,sVar13 * -0x20,1);
  }
  prims->size_active = uVar18;
  prims->size_alloced = uVar20;
  pPVar22 = local_2958;
LAB_003dadc1:
  uVar14 = (ulong)(mesh_local->super_Geometry).numPrimitives;
  local_2920 = &mesh_local;
  local_2908 = &geomID_;
  local_2950[1] = 0;
  local_2950[0] = uVar14;
  local_2918 = prims;
  local_2910 = sgrids;
  iVar6 = tbb::detail::d1::max_concurrency();
  pp_Var21 = (_func_int **)(uVar14 + 0x3ff >> 10);
  if ((_func_int **)(long)iVar6 < pp_Var21) {
    pp_Var21 = (_func_int **)(long)iVar6;
  }
  pp_Var16 = (_func_int **)0x40;
  if (pp_Var21 < (_func_int **)0x40) {
    pp_Var16 = pp_Var21;
  }
  local_2900 = local_2950 + 1;
  local_28f8 = local_2950;
  local_28f0 = &taskCount;
  local_28e8 = &pstate;
  local_28e0 = &local_2920;
  taskCount = (size_t)pp_Var16;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  local_2940 = &local_2900;
  if (pp_Var21 != (_func_int **)0x0) {
    local_2938.m_version_and_traits = 0;
    ptVar7 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_2938,0xc0);
    ptVar7->m_reserved[3] = 0;
    ptVar7->m_reserved[4] = 0;
    ptVar7->m_reserved[5] = 0;
    ptVar7->m_reserved[1] = 0;
    ptVar7->m_reserved[2] = 0;
    (ptVar7->super_task_traits).m_version_and_traits = 0;
    ptVar7->m_reserved[0] = 0;
    ptVar7->_vptr_task = (_func_int **)&PTR__task_021d9a18;
    ptVar7[1]._vptr_task = pp_Var16;
    ptVar7[1].super_task_traits.m_version_and_traits = 0;
    ptVar7[1].m_reserved[0] = 1;
    ptVar7[1].m_reserved[1] = (uint64_t)&local_2940;
    ptVar7[1].m_reserved[2] = 0;
    ptVar7[1].m_reserved[3] = 1;
    tbb::detail::d1::auto_partition_type::auto_partition_type
              ((auto_partition_type *)(ptVar7[1].m_reserved + 5),&local_2961);
    ptVar7[2].super_task_traits.m_version_and_traits = local_2938.m_version_and_traits;
    local_28d8 = 0;
    local_28d0 = 1;
    local_28c8.m_version_and_traits = 1;
    local_28c8.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1
    ;
    ptVar7[1].m_reserved[4] = (uint64_t)&local_28d8;
    tbb::detail::r1::execute_and_wait(ptVar7,&context,&local_28c8,&context);
  }
  cVar5 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar5 != '\0') {
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar12,"task cancelled");
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::d1::task_group_context::~task_group_context(&context);
  psVar15 = &pstate.sums[0].end;
  sVar13 = 0;
  sVar8 = 0;
  aVar24 = _DAT_01f45a40;
  aVar25 = _DAT_01f45a30;
  aVar26 = _DAT_01f45a40;
  aVar27 = _DAT_01f45a30;
  while (bVar23 = taskCount != 0, taskCount = taskCount - 1, bVar23) {
    (((PrimInfoT<embree::BBox<embree::Vec3fa>_> *)(psVar15 + -9))->
    super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 = aVar27;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar15 + -7) = aVar26;
    (((BBox3fa *)(psVar15 + -5))->lower).field_0 = aVar25;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar15 + -3) = aVar24;
    psVar15[-1] = sVar13;
    *psVar15 = sVar8;
    aVar27.m128 = (__m128)minps(aVar27.m128,*(undefined1 (*) [16])(psVar15 + -0x289));
    aVar26.m128 = (__m128)maxps(aVar26.m128,*(undefined1 (*) [16])(psVar15 + -0x287));
    aVar25.m128 = (__m128)minps(aVar25.m128,*(undefined1 (*) [16])(psVar15 + -0x285));
    aVar24.m128 = (__m128)maxps(aVar24.m128,*(undefined1 (*) [16])(psVar15 + -0x283));
    sVar13 = sVar13 + psVar15[-0x281];
    sVar8 = sVar8 + psVar15[-0x280];
    psVar15 = psVar15 + 10;
  }
  (pPVar22->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 = aVar27;
  (pPVar22->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 = aVar26;
  (pPVar22->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 = aVar25;
  (pPVar22->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 = aVar24;
  pPVar22->begin = sVar13;
  pPVar22->end = sVar8;
  return pPVar22;
}

Assistant:

PrimInfo createPrimRefArrayGrids(GridMesh* mesh, mvector<PrimRef>& prims, mvector<SubGridBuildData>& sgrids)
    {
      unsigned int geomID_ = std::numeric_limits<unsigned int>::max ();

      PrimInfo pinfo(empty);
      size_t numPrimitives = 0;
      
      ParallelPrefixSumState<PrimInfo> pstate;
      /* iterate over all grids in a single mesh */
      pinfo = parallel_prefix_sum( pstate, size_t(0), mesh->size(), size_t(1024), PrimInfo(empty), [&](const range<size_t>& r, const PrimInfo& base) -> PrimInfo
                                   {
                                     PrimInfo pinfo(empty);
                                     for (size_t j=r.begin(); j<r.end(); j++)
                                     {
                                       if (!mesh->valid(j)) continue;
                                       BBox3fa bounds = empty;
                                       const PrimRef prim(bounds,geomID_,unsigned(j));
                                       pinfo.add_center2(prim,mesh->getNumSubGrids(j));
                                     }
                                     return pinfo;
                                   }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
      numPrimitives = pinfo.size();
      /* resize arrays */
      sgrids.resize(numPrimitives); 
      prims.resize(numPrimitives); 

      /* second run to fill primrefs and SubGridBuildData arrays */
      pinfo = parallel_prefix_sum( pstate, size_t(0), mesh->size(), size_t(1024), PrimInfo(empty), [&](const range<size_t>& r, const PrimInfo& base) -> PrimInfo {
        return mesh->createPrimRefArray(prims,sgrids,r,base.size(),geomID_);
      }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });

      return pinfo;
    }